

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Help_View.cxx
# Opt level: O1

void __thiscall Fl_Help_View::Fl_Help_View(Fl_Help_View *this,int xx,int yy,int ww,int hh,char *l)

{
  Fl_Scrollbar *this_00;
  Fl_Scrollbar *this_01;
  int iVar1;
  int iVar2;
  int iVar3;
  undefined4 in_register_00000034;
  
  Fl_Group::Fl_Group(&this->super_Fl_Group,xx,yy,ww,hh,l);
  (this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget = (_func_int **)&PTR__Fl_Help_View_00277ab8
  ;
  (this->fstack_).nfonts_ = 0;
  iVar1 = Fl::scrollbar_size();
  iVar2 = Fl::scrollbar_size();
  iVar3 = Fl::scrollbar_size();
  this_00 = &this->scrollbar_;
  Fl_Scrollbar::Fl_Scrollbar(this_00,(ww + xx) - iVar1,yy,iVar2,hh - iVar3,(char *)0x0);
  iVar1 = Fl::scrollbar_size();
  iVar2 = Fl::scrollbar_size();
  iVar3 = Fl::scrollbar_size();
  this_01 = &this->hscrollbar_;
  Fl_Scrollbar::Fl_Scrollbar(this_01,xx,(hh + yy) - iVar1,ww - iVar2,iVar3,(char *)0x0);
  (this->super_Fl_Group).super_Fl_Widget.color_ = 7;
  (this->super_Fl_Group).super_Fl_Widget.color2_ = 0xf;
  this->title_[0] = '\0';
  this->defcolor_ = 0;
  this->bgcolor_ = 0x31;
  this->textcolor_ = 0;
  this->linkcolor_ = 0xf;
  this->textfont_ = 8;
  this->textsize_ = 0xc;
  this->value_ = (char *)0x0;
  this->filename_[0] = '\0';
  this->nblocks_ = 0;
  this->ablocks_ = 0;
  this->blocks_ = (Fl_Help_Block *)0x0;
  this->link_ = (Fl_Help_Func *)0x0;
  this->nlinks_ = 0;
  this->alinks_ = 0;
  this->links_ = (Fl_Help_Link *)0x0;
  this->ntargets_ = 0;
  this->atargets_ = 0;
  *(undefined8 *)((long)&this->ntargets_ + 1) = 0;
  *(undefined8 *)((long)&this->targets_ + 1) = 0;
  this->topline_ = 0;
  this->leftline_ = 0;
  this->size_ = 0;
  this->hsize_ = 0;
  this->scrollbar_size_ = 0;
  Fl_Slider::scrollvalue(&this_00->super_Fl_Slider,0,hh,0,1);
  Fl_Valuator::step((Fl_Valuator *)this_00,8.0);
  Fl_Widget::show((Fl_Widget *)this_00);
  (this->scrollbar_).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.callback_ =
       scrollbar_callback;
  Fl_Slider::scrollvalue(&this_01->super_Fl_Slider,0,ww,0,1);
  Fl_Valuator::step((Fl_Valuator *)this_01,8.0);
  Fl_Widget::show((Fl_Widget *)this_01);
  (this->hscrollbar_).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.callback_ =
       hscrollbar_callback;
  (this->hscrollbar_).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.type_ = '\x01';
  Fl_Group::end(&this->super_Fl_Group);
  (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[4])
            (this,CONCAT44(in_register_00000034,xx),(ulong)(uint)yy,(ulong)(uint)ww,(ulong)(uint)hh)
  ;
  return;
}

Assistant:

Fl_Help_View::Fl_Help_View(int        xx,	// I - Left position
                	   int        yy,	// I - Top position
			   int        ww,	// I - Width in pixels
			   int        hh,	// I - Height in pixels
			   const char *l)
    : Fl_Group(xx, yy, ww, hh, l),
      scrollbar_(xx + ww - Fl::scrollbar_size(), yy,
                 Fl::scrollbar_size(), hh - Fl::scrollbar_size()),
      hscrollbar_(xx, yy + hh - Fl::scrollbar_size(),
                  ww - Fl::scrollbar_size(), Fl::scrollbar_size())
{
  color(FL_BACKGROUND2_COLOR, FL_SELECTION_COLOR);

  title_[0]     = '\0';
  defcolor_     = FL_FOREGROUND_COLOR;
  bgcolor_      = FL_BACKGROUND_COLOR;
  textcolor_    = FL_FOREGROUND_COLOR;
  linkcolor_    = FL_SELECTION_COLOR;
  textfont_     = FL_TIMES;
  textsize_     = 12;
  value_        = NULL;

  ablocks_      = 0;
  nblocks_      = 0;
  blocks_       = (Fl_Help_Block *)0;

  link_         = (Fl_Help_Func *)0;

  alinks_       = 0;
  nlinks_       = 0;
  links_        = (Fl_Help_Link *)0;

  atargets_     = 0;
  ntargets_     = 0;
  targets_      = (Fl_Help_Target *)0;

  directory_[0] = '\0';
  filename_[0]  = '\0';

  topline_      = 0;
  leftline_     = 0;
  size_         = 0;
  hsize_        = 0;
  scrollbar_size_ = 0;

  scrollbar_.value(0, hh, 0, 1);
  scrollbar_.step(8.0);
  scrollbar_.show();
  scrollbar_.callback(scrollbar_callback);

  hscrollbar_.value(0, ww, 0, 1);
  hscrollbar_.step(8.0);
  hscrollbar_.show();
  hscrollbar_.callback(hscrollbar_callback);
  hscrollbar_.type(FL_HORIZONTAL);
  end();

  resize(xx, yy, ww, hh);
}